

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_SimpleSyntaxError_Test::TestBody
          (ParseErrorTest_SimpleSyntaxError_Test *this)

{
  Parser *pPVar1;
  char *message;
  string_view text;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined1 local_28 [8];
  VTable *local_20;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_28,"0:20: Expected \"{\".\n");
  text._M_str = "message TestMessage @#$ { blah }";
  text._M_len = 0x20;
  ParserTest::ExpectHasErrors
            (&this->super_ParseErrorTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_28);
  pPVar1 = (this->super_ParseErrorTest).parser_._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::Parser_*,_std::default_delete<google::protobuf::compiler::Parser>_>
           .super__Head_base<0UL,_google::protobuf::compiler::Parser_*,_false>._M_head_impl;
  local_38._M_str = (pPVar1->syntax_identifier_)._M_dataplus._M_p;
  local_38._M_len = (pPVar1->syntax_identifier_)._M_string_length;
  testing::internal::CmpHelperEQ<char[7],std::basic_string_view<char,std::char_traits<char>>>
            ((internal *)local_28,"\"proto2\"","parser_->GetSyntaxIdentifier()",
             (char (*) [7])0x12499be,&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (VTable *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = ((_Alloc_hider *)&local_20->match_and_explain)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0x5de,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_38._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_len + 8))();
    }
  }
  if (local_20 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20);
  }
  return;
}

Assistant:

TEST_F(ParseErrorTest, SimpleSyntaxError) {
  ExpectHasErrors("message TestMessage @#$ { blah }",
                  "0:20: Expected \"{\".\n");
  EXPECT_EQ("proto2", parser_->GetSyntaxIdentifier());
}